

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

_Bool golf_script_load(golf_script_t *script,char *path,char *data,int data_len)

{
  map_base_t *pmVar1;
  _Bool _Var2;
  int iVar3;
  long lVar4;
  undefined1 local_1c0 [8];
  gs_val_t val;
  gs_stmt_t *stmt;
  anon_union_16_10_4eabebd3_for_gs_val_2 local_198;
  gs_val_t local_188;
  gs_val_t local_170;
  gs_val_t local_158;
  gs_val_t local_140;
  gs_val_t local_128;
  gs_val_t local_110;
  gs_val_t local_f8;
  gs_val_t local_e0;
  gs_val_t local_c8;
  gs_val_t local_b0;
  gs_val_t local_98;
  gs_val_t local_80;
  gs_val_t local_68;
  gs_val_t local_50;
  map_base_t *local_38;
  gs_env_t *global_env;
  char *pcStack_28;
  int data_len_local;
  char *data_local;
  char *path_local;
  golf_script_t *script_local;
  
  global_env._4_4_ = data_len;
  pcStack_28 = data;
  data_local = path;
  path_local = script->path;
  iVar3 = vec_expand_((char **)&_gs_store,&_gs_store.scripts.length,&_gs_store.scripts.capacity,8,
                      _gs_store.scripts.alloc_category);
  if (iVar3 == 0) {
    lVar4 = (long)_gs_store.scripts.length;
    _gs_store.scripts.length = _gs_store.scripts.length + 1;
    _gs_store.scripts.data[lVar4] = (golf_script_t *)path_local;
  }
  snprintf(path_local,0x400,"%s",data_local);
  path_local[0x400] = '\0';
  path_local[0x401] = '\0';
  path_local[0x402] = '\0';
  path_local[0x403] = '\0';
  path_local[0x404] = '\0';
  path_local[0x405] = '\0';
  path_local[0x406] = '\0';
  path_local[0x407] = '\0';
  memset(path_local + 0x408,0,0x18);
  *(char **)(path_local + 0x418) = "script/parser";
  path_local[0x420] = '\0';
  path_local[0x421] = '\0';
  path_local[0x422] = '\0';
  path_local[0x423] = '\0';
  path_local[0x424] = '\0';
  memset(path_local + 0xc40,0,0x18);
  *(char **)(path_local + 0xc50) = "script/parser";
  gs_tokenize((gs_parser_t *)(path_local + 0x408),pcStack_28);
  if ((path_local[0x424] & 1U) == 0) {
    local_38 = (map_base_t *)golf_alloc_tracked(0x38,"script/eval");
    memset(local_38,0,0x38);
    pmVar1 = local_38;
    local_38[3].buckets = (map_node_t **)"script/eval";
    gs_val_float(&local_50,3.1415927);
    *(undefined8 *)&pmVar1[1].nbuckets = local_50._0_8_;
    pmVar1[2].buckets = (map_node_t **)local_50.field_2.vec2_val;
    pmVar1[2].nbuckets = local_50.field_2._8_4_;
    pmVar1[2].nnodes = local_50.field_2._12_4_;
    map_set_(local_38,"PI",&local_38[1].nbuckets,0x18,(char *)local_38[3].buckets);
    pmVar1 = local_38;
    gs_val_bool(&local_68,true);
    *(undefined8 *)&pmVar1[1].nbuckets = local_68._0_8_;
    pmVar1[2].buckets = (map_node_t **)local_68.field_2.vec2_val;
    pmVar1[2].nbuckets = local_68.field_2._8_4_;
    pmVar1[2].nnodes = local_68.field_2._12_4_;
    map_set_(local_38,"true",&local_38[1].nbuckets,0x18,(char *)local_38[3].buckets);
    pmVar1 = local_38;
    gs_val_bool(&local_80,false);
    *(undefined8 *)&pmVar1[1].nbuckets = local_80._0_8_;
    pmVar1[2].buckets = (map_node_t **)local_80.field_2.vec2_val;
    pmVar1[2].nbuckets = local_80.field_2._8_4_;
    pmVar1[2].nnodes = local_80.field_2._12_4_;
    map_set_(local_38,"false",&local_38[1].nbuckets,0x18,(char *)local_38[3].buckets);
    pmVar1 = local_38;
    gs_val_c_fn(&local_98,gs_c_fn_print);
    *(undefined8 *)&pmVar1[1].nbuckets = local_98._0_8_;
    pmVar1[2].buckets = (map_node_t **)local_98.field_2.vec2_val;
    pmVar1[2].nbuckets = local_98.field_2._8_4_;
    pmVar1[2].nnodes = local_98.field_2._12_4_;
    map_set_(local_38,"print",&local_38[1].nbuckets,0x18,(char *)local_38[3].buckets);
    pmVar1 = local_38;
    gs_val_c_fn(&local_b0,gs_c_fn_V2);
    *(undefined8 *)&pmVar1[1].nbuckets = local_b0._0_8_;
    pmVar1[2].buckets = (map_node_t **)local_b0.field_2.vec2_val;
    pmVar1[2].nbuckets = local_b0.field_2._8_4_;
    pmVar1[2].nnodes = local_b0.field_2._12_4_;
    map_set_(local_38,"V2",&local_38[1].nbuckets,0x18,(char *)local_38[3].buckets);
    pmVar1 = local_38;
    gs_val_c_fn(&local_c8,gs_c_fn_V3);
    *(undefined8 *)&pmVar1[1].nbuckets = local_c8._0_8_;
    pmVar1[2].buckets = (map_node_t **)local_c8.field_2.vec2_val;
    pmVar1[2].nbuckets = local_c8.field_2._8_4_;
    pmVar1[2].nnodes = local_c8.field_2._12_4_;
    map_set_(local_38,"V3",&local_38[1].nbuckets,0x18,(char *)local_38[3].buckets);
    pmVar1 = local_38;
    gs_val_c_fn(&local_e0,gs_c_fn_vec2_bezier4);
    *(undefined8 *)&pmVar1[1].nbuckets = local_e0._0_8_;
    pmVar1[2].buckets = (map_node_t **)local_e0.field_2.vec2_val;
    pmVar1[2].nbuckets = local_e0.field_2._8_4_;
    pmVar1[2].nnodes = local_e0.field_2._12_4_;
    map_set_(local_38,"vec2_bezier4",&local_38[1].nbuckets,0x18,(char *)local_38[3].buckets);
    pmVar1 = local_38;
    gs_val_c_fn(&local_f8,gs_c_fn_vec3_distance);
    *(undefined8 *)&pmVar1[1].nbuckets = local_f8._0_8_;
    pmVar1[2].buckets = (map_node_t **)local_f8.field_2.vec2_val;
    pmVar1[2].nbuckets = local_f8.field_2._8_4_;
    pmVar1[2].nnodes = local_f8.field_2._12_4_;
    map_set_(local_38,"vec3_distance",&local_38[1].nbuckets,0x18,(char *)local_38[3].buckets);
    pmVar1 = local_38;
    gs_val_c_fn(&local_110,gs_c_fn_vec3_length);
    *(undefined8 *)&pmVar1[1].nbuckets = local_110._0_8_;
    pmVar1[2].buckets = (map_node_t **)local_110.field_2.vec2_val;
    pmVar1[2].nbuckets = local_110.field_2._8_4_;
    pmVar1[2].nnodes = local_110.field_2._12_4_;
    map_set_(local_38,"vec3_length",&local_38[1].nbuckets,0x18,(char *)local_38[3].buckets);
    pmVar1 = local_38;
    gs_val_c_fn(&local_128,gs_c_fn_vec3_normalize);
    *(undefined8 *)&pmVar1[1].nbuckets = local_128._0_8_;
    pmVar1[2].buckets = (map_node_t **)local_128.field_2.vec2_val;
    pmVar1[2].nbuckets = local_128.field_2._8_4_;
    pmVar1[2].nnodes = local_128.field_2._12_4_;
    map_set_(local_38,"vec3_normalize",&local_38[1].nbuckets,0x18,(char *)local_38[3].buckets);
    pmVar1 = local_38;
    gs_val_c_fn(&local_140,gs_c_fn_cos);
    *(undefined8 *)&pmVar1[1].nbuckets = local_140._0_8_;
    pmVar1[2].buckets = (map_node_t **)local_140.field_2.vec2_val;
    pmVar1[2].nbuckets = local_140.field_2._8_4_;
    pmVar1[2].nnodes = local_140.field_2._12_4_;
    map_set_(local_38,"cos",&local_38[1].nbuckets,0x18,(char *)local_38[3].buckets);
    pmVar1 = local_38;
    gs_val_c_fn(&local_158,gs_c_fn_sin);
    *(undefined8 *)&pmVar1[1].nbuckets = local_158._0_8_;
    pmVar1[2].buckets = (map_node_t **)local_158.field_2.vec2_val;
    pmVar1[2].nbuckets = local_158.field_2._8_4_;
    pmVar1[2].nnodes = local_158.field_2._12_4_;
    map_set_(local_38,"sin",&local_38[1].nbuckets,0x18,(char *)local_38[3].buckets);
    pmVar1 = local_38;
    gs_val_c_fn(&local_170,gs_c_fn_acos);
    *(undefined8 *)&pmVar1[1].nbuckets = local_170._0_8_;
    pmVar1[2].buckets = (map_node_t **)local_170.field_2.vec2_val;
    pmVar1[2].nbuckets = local_170.field_2._8_4_;
    pmVar1[2].nnodes = local_170.field_2._12_4_;
    map_set_(local_38,"acos",&local_38[1].nbuckets,0x18,(char *)local_38[3].buckets);
    pmVar1 = local_38;
    gs_val_c_fn(&local_188,gs_c_fn_asin);
    *(undefined8 *)&pmVar1[1].nbuckets = local_188._0_8_;
    pmVar1[2].buckets = (map_node_t **)local_188.field_2.vec2_val;
    pmVar1[2].nbuckets = local_188.field_2._8_4_;
    pmVar1[2].nnodes = local_188.field_2._12_4_;
    map_set_(local_38,"asin",&local_38[1].nbuckets,0x18,(char *)local_38[3].buckets);
    pmVar1 = local_38;
    gs_val_c_fn((gs_val_t *)&stmt,gs_c_fn_sqrt);
    *(gs_stmt_t **)&pmVar1[1].nbuckets = stmt;
    pmVar1[2].buckets = (map_node_t **)local_198.vec2_val;
    pmVar1[2].nbuckets = local_198._8_4_;
    pmVar1[2].nnodes = local_198._12_4_;
    map_set_(local_38,"sqrt",&local_38[1].nbuckets,0x18,(char *)local_38[3].buckets);
    memset(path_local + 0xc88,0,0x18);
    *(char **)(path_local + 0xc98) = "script/eval";
    iVar3 = vec_expand_((char **)(path_local + 0xc88),(int *)(path_local + 0xc90),
                        (int *)(path_local + 0xc94),8,*(char **)(path_local + 0xc98));
    if (iVar3 == 0) {
      iVar3 = *(int *)(path_local + 0xc90);
      *(int *)(path_local + 0xc90) = iVar3 + 1;
      *(map_base_t **)(*(long *)(path_local + 0xc88) + (long)iVar3 * 8) = local_38;
    }
    memset(path_local + 0xc58,0,0x18);
    *(char **)(path_local + 0xc68) = "script/eval";
    memset(path_local + 0xc70,0,0x18);
    *(char **)(path_local + 0xc80) = "script/eval";
    do {
      _Var2 = gs_peek_eof((gs_parser_t *)(path_local + 0x408));
      if (((_Var2 ^ 0xffU) & 1) == 0) {
        return true;
      }
      val.field_2._8_8_ = gs_parse_stmt((gs_parser_t *)(path_local + 0x408));
      if ((path_local[0x424] & 1U) != 0) {
        *(char **)(path_local + 0x400) = path_local + 0x425;
        return true;
      }
      gs_eval_stmt((gs_val_t *)local_1c0,(gs_eval_t *)(path_local + 0xc58),
                   (gs_stmt_t *)val.field_2._8_8_);
    } while (local_1c0._0_4_ != GS_VAL_ERROR);
    *(undefined8 *)(path_local + 0x400) = val._0_8_;
  }
  else {
    *(char **)(path_local + 0x400) = path_local + 0x425;
  }
  return true;
}

Assistant:

bool golf_script_load(golf_script_t *script, const char *path, const char *data, int data_len) {
    GOLF_UNUSED(data_len);

    vec_push(&_gs_store.scripts, script);

    snprintf(script->path, GOLF_FILE_MAX_PATH, "%s", path);
    script->error = NULL;
    vec_init(&script->parser.tokens, "script/parser");
    script->parser.cur_token = 0;
    script->parser.error = false;
    vec_init(&script->parser.allocated_memory, "script/parser");

    gs_tokenize(&script->parser, data);
    if (script->parser.error) {
        script->error = script->parser.error_string;
        return true;
    }
    if (false) {
        gs_debug_print_tokens(&script->parser.tokens);
    }

    gs_env_t *global_env = golf_alloc_tracked(sizeof(gs_env_t), "script/eval");
    map_init(&global_env->val_map, "script/eval");
    map_set(&global_env->val_map, "PI", gs_val_float(MF_PI));
    map_set(&global_env->val_map, "true", gs_val_bool(true));
    map_set(&global_env->val_map, "false", gs_val_bool(false));
    map_set(&global_env->val_map, "print", gs_val_c_fn(gs_c_fn_print));
    map_set(&global_env->val_map, "V2", gs_val_c_fn(gs_c_fn_V2));
    map_set(&global_env->val_map, "V3", gs_val_c_fn(gs_c_fn_V3));
    map_set(&global_env->val_map, "vec2_bezier4", gs_val_c_fn(gs_c_fn_vec2_bezier4));
    map_set(&global_env->val_map, "vec3_distance", gs_val_c_fn(gs_c_fn_vec3_distance));
    map_set(&global_env->val_map, "vec3_length", gs_val_c_fn(gs_c_fn_vec3_length));
    map_set(&global_env->val_map, "vec3_normalize", gs_val_c_fn(gs_c_fn_vec3_normalize));
    map_set(&global_env->val_map, "cos", gs_val_c_fn(gs_c_fn_cos));
    map_set(&global_env->val_map, "sin", gs_val_c_fn(gs_c_fn_sin));
    map_set(&global_env->val_map, "acos", gs_val_c_fn(gs_c_fn_acos));
    map_set(&global_env->val_map, "asin", gs_val_c_fn(gs_c_fn_asin));
    map_set(&global_env->val_map, "sqrt", gs_val_c_fn(gs_c_fn_sqrt));
    //map_set(&global_env->val_map, "terrain_model_add_point", gs_val_c_fn(gs_c_fn_terrain_model_add_point));
    //map_set(&global_env->val_map, "terrain_model_add_face", gs_val_c_fn(gs_c_fn_terrain_model_add_face));

    vec_init(&script->eval.env, "script/eval");
    vec_push(&script->eval.env, global_env);
    vec_init(&script->eval.allocated_strings, "script/eval");
    vec_init(&script->eval.allocated_lists, "script/eval");

    while (!gs_peek_eof(&script->parser)) {
        gs_stmt_t *stmt = gs_parse_stmt(&script->parser);
        if (script->parser.error) {
            script->error = script->parser.error_string;
            return true;
        }

        gs_val_t val = gs_eval_stmt(&script->eval, stmt);
        if (val.type == GS_VAL_ERROR) {
            script->error = val.error_val;
            return true;
        }
        if (false) {
            gs_debug_print_stmt(stmt, 0);
            gs_debug_print_val(val);
            printf("\n");
        }
    }

    return true;
}